

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall ExprTest_SymbolicIfExpr_Test::TestBody(ExprTest_SymbolicIfExpr_Test *this)

{
  Expr else_expr_00;
  Expr else_expr_01;
  Expr else_expr_02;
  Expr else_expr_03;
  StringRef value;
  LogicalExpr condition_00;
  LogicalExpr condition_01;
  LogicalExpr condition_02;
  LogicalExpr condition_03;
  bool bVar1;
  AssertHelper *this_00;
  AssertionFailure *e_2;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_5;
  AssertionFailure *e_1;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  Expr else_expr;
  Expr then_expr;
  LogicalConstant condition;
  AssertionResult gtest_ar_;
  SymbolicIfExpr e;
  BasicExprFactory<std::allocator<char>_> *in_stack_fffffffffffffbb8;
  BasicStringRef<char> *in_stack_fffffffffffffbc0;
  type_conflict tVar2;
  BasicExprFactory<std::allocator<char>_> *in_stack_fffffffffffffbc8;
  ExprBase in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbdc;
  ExprBase in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe8;
  Type in_stack_fffffffffffffbec;
  AssertionResult *in_stack_fffffffffffffbf0;
  char *in_stack_fffffffffffffbf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc00;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  char *in_stack_fffffffffffffc28;
  char *in_stack_fffffffffffffc30;
  AssertionResult *in_stack_fffffffffffffc38;
  AssertHelper *in_stack_fffffffffffffc40;
  allocator<char> local_261;
  string local_260 [32];
  AssertionResult local_240 [3];
  int local_20c;
  BasicExpr<(mp::expr::Kind)71,_(mp::expr::Kind)71> local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  byte local_1e2;
  allocator<char> local_1e1;
  string local_1e0 [32];
  AssertionResult local_1c0 [2];
  ExprBase local_1a0;
  AssertionResult local_198 [2];
  ExprBase local_178;
  AssertionResult local_170 [2];
  ExprBase local_150;
  AssertionResult local_148 [2];
  Kind local_128;
  undefined4 local_124;
  AssertionResult local_120;
  string local_110 [48];
  AssertionResult local_e0;
  undefined8 local_d0;
  undefined8 local_c8;
  Impl *local_c0;
  BasicExpr<(mp::expr::Kind)71,_(mp::expr::Kind)71> local_b0;
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_a8;
  undefined8 local_a0;
  BasicExpr<(mp::expr::Kind)70,_(mp::expr::Kind)70> local_88;
  undefined8 local_80;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48> local_78;
  Impl *local_70;
  string local_60 [64];
  AssertionResult local_20;
  ExprBase local_10 [2];
  
  mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>::
  BasicIfExpr((BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>
               *)0x12e224);
  mp::internal::ExprBase::operator_cast_to_function_pointer(local_10);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_fffffffffffffbc0,
             SUB81((ulong)in_stack_fffffffffffffbb8 >> 0x38,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbf0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
               (char *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
               (char *)in_stack_fffffffffffffbe0.impl_,in_stack_fffffffffffffbdc,
               (char *)in_stack_fffffffffffffbd0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc40,(Message *)in_stack_fffffffffffffc38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbc0);
    std::__cxx11::string::~string(local_60);
    testing::Message::~Message((Message *)0x12e345);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12e3c0);
  local_70 = local_10[0].impl_;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,(mp::expr::Kind)71>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_stack_fffffffffffffbc8,
             (BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>)
             in_stack_fffffffffffffbd0.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffbc0 >> 0x20));
  local_78.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant
                 (in_stack_fffffffffffffbc8,SUB81((ulong)in_stack_fffffffffffffbc0 >> 0x38,0));
  fmt::BasicStringRef<char>::BasicStringRef
            (in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
  value.size_._0_4_ = in_stack_fffffffffffffbe8;
  value.data_ = (char *)in_stack_fffffffffffffbe0.impl_;
  value.size_._4_4_ = in_stack_fffffffffffffbec;
  local_88.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeStringLiteral
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),value);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::StringLiteral>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_stack_fffffffffffffbc8,
             (StringLiteral)in_stack_fffffffffffffbd0.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffbc0 >> 0x20));
  local_a8.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeVariable(in_stack_fffffffffffffbb8,0);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::Reference>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_stack_fffffffffffffbc8,
             (Reference)in_stack_fffffffffffffbd0.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffbc0 >> 0x20));
  local_c0 = (Impl *)local_78.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffbc8,
             (LogicalConstant)in_stack_fffffffffffffbd0.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffbc0 >> 0x20));
  local_c8 = local_80;
  local_d0 = local_a0;
  condition_00.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffbec;
  condition_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffbe8;
  else_expr_00.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffbdc;
  else_expr_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffbd8;
  local_b0.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeSymbolicIf
                 ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffbd0.impl_,
                  condition_00,(Expr)in_stack_fffffffffffffbe0.impl_,else_expr_00);
  local_10[0].impl_ = (Impl *)local_b0.super_ExprBase.impl_;
  mp::internal::ExprBase::operator_cast_to_function_pointer(local_10);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_fffffffffffffbc0,
             SUB81((ulong)in_stack_fffffffffffffbb8 >> 0x38,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbf0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
               (char *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
               (char *)in_stack_fffffffffffffbe0.impl_,in_stack_fffffffffffffbdc,
               (char *)in_stack_fffffffffffffbd0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc40,(Message *)in_stack_fffffffffffffc38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbc0);
    std::__cxx11::string::~string(local_110);
    testing::Message::~Message((Message *)0x12e651);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12e6cc);
  local_124 = 0x47;
  local_128 = mp::internal::ExprBase::kind((ExprBase *)0x12e6e4);
  testing::internal::EqHelper<false>::Compare<mp::expr::Kind,mp::expr::Kind>
            ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
             (char *)in_stack_fffffffffffffbd0.impl_,(Kind *)in_stack_fffffffffffffbc8,
             (Kind *)in_stack_fffffffffffffbc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_120);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbf0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12e78d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
               (char *)in_stack_fffffffffffffbe0.impl_,in_stack_fffffffffffffbdc,
               (char *)in_stack_fffffffffffffbd0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc40,(Message *)in_stack_fffffffffffffc38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbc0);
    testing::Message::~Message((Message *)0x12e7f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12e845);
  local_150.impl_ =
       (Impl *)mp::
               BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>
               ::condition((BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>
                            *)in_stack_fffffffffffffbb8);
  testing::internal::EqHelper<false>::
  Compare<mp::LogicalConstant,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
             (char *)in_stack_fffffffffffffbd0.impl_,(LogicalConstant *)in_stack_fffffffffffffbc8,
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffbc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_148);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbf0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12e8fc);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
               (char *)in_stack_fffffffffffffbe0.impl_,in_stack_fffffffffffffbdc,
               (char *)in_stack_fffffffffffffbd0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc40,(Message *)in_stack_fffffffffffffc38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbc0);
    testing::Message::~Message((Message *)0x12e95f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12e9b4);
  local_178.impl_ =
       (Impl *)mp::
               BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>
               ::then_expr((BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>
                            *)in_stack_fffffffffffffbb8);
  testing::internal::EqHelper<false>::
  Compare<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>
            ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
             (char *)in_stack_fffffffffffffbd0.impl_,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_stack_fffffffffffffbc8,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_stack_fffffffffffffbc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_170);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbf0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12ea6b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
               (char *)in_stack_fffffffffffffbe0.impl_,in_stack_fffffffffffffbdc,
               (char *)in_stack_fffffffffffffbd0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc40,(Message *)in_stack_fffffffffffffc38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbc0);
    testing::Message::~Message((Message *)0x12eace);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12eb23);
  local_1a0.impl_ =
       (Impl *)mp::
               BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>
               ::else_expr((BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>
                            *)in_stack_fffffffffffffbb8);
  testing::internal::EqHelper<false>::
  Compare<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>
            ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
             (char *)in_stack_fffffffffffffbd0.impl_,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_stack_fffffffffffffbc8,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_stack_fffffffffffffbc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_198);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbf0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12ebda);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
               (char *)in_stack_fffffffffffffbe0.impl_,in_stack_fffffffffffffbdc,
               (char *)in_stack_fffffffffffffbd0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc40,(Message *)in_stack_fffffffffffffc38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbc0);
    testing::Message::~Message((Message *)0x12ec3d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12ec95);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1c0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
               (allocator<char> *)in_stack_fffffffffffffbf0);
    std::allocator<char>::~allocator(&local_1e1);
    local_1e2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr
                ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)0x12ed57);
      local_1f8 = local_80;
      local_200 = local_a0;
      condition_01.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffbec;
      condition_01.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffbe8;
      else_expr_01.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffbdc;
      else_expr_01.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffbd8;
      local_208.super_ExprBase.impl_ =
           (ExprBase)
           mp::BasicExprFactory<std::allocator<char>_>::MakeSymbolicIf
                     ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffbd0.impl_,
                      condition_01,(Expr)in_stack_fffffffffffffbe0.impl_,else_expr_01);
    }
    if ((local_1e2 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffbf0,
                 (char (*) [146])CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      local_20c = 2;
    }
    else {
      local_20c = 0;
    }
    std::__cxx11::string::~string(local_1e0);
    if (local_20c != 0) goto LAB_0012f081;
  }
  else {
LAB_0012f081:
    testing::Message::Message((Message *)in_stack_fffffffffffffbf0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12f09d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
               (char *)in_stack_fffffffffffffbe0.impl_,in_stack_fffffffffffffbdc,
               (char *)in_stack_fffffffffffffbd0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc40,(Message *)in_stack_fffffffffffffc38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbc0);
    testing::Message::~Message((Message *)0x12f0fa);
  }
  tVar2 = (type_conflict)((ulong)in_stack_fffffffffffffbc0 >> 0x20);
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12f152);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_240);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
               (allocator<char> *)in_stack_fffffffffffffbf0);
    std::allocator<char>::~allocator(&local_261);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
                ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffbc8,
                 (LogicalConstant)in_stack_fffffffffffffbd0.impl_,tVar2);
      mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr
                ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)0x12f222);
      condition_02.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffbec;
      condition_02.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffbe8;
      else_expr_02.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffbdc;
      else_expr_02.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffbd8;
      mp::BasicExprFactory<std::allocator<char>_>::MakeSymbolicIf
                ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffbd0.impl_,
                 condition_02,(Expr)in_stack_fffffffffffffbe0.impl_,else_expr_02);
    }
    testing::AssertionResult::operator<<
              (in_stack_fffffffffffffbf0,
               (char (*) [139])CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    local_20c = 3;
    std::__cxx11::string::~string(local_260);
    if (local_20c == 0) goto LAB_0012f5d9;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffbf0);
  this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x12f531);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
             (char *)in_stack_fffffffffffffbe0.impl_,in_stack_fffffffffffffbdc,
             (char *)in_stack_fffffffffffffbd0.impl_);
  testing::internal::AssertHelper::operator=
            (in_stack_fffffffffffffc40,(Message *)in_stack_fffffffffffffc38);
  testing::internal::AssertHelper::~AssertHelper(this_00);
  tVar2 = (type_conflict)((ulong)this_00 >> 0x20);
  testing::Message::~Message((Message *)0x12f58e);
LAB_0012f5d9:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12f5e6);
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffbc8,
             (LogicalConstant)in_stack_fffffffffffffbd0.impl_,tVar2);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)0x12f63a);
  condition_03.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffbec;
  condition_03.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffbe8;
  else_expr_03.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffbdc;
  else_expr_03.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffbd8;
  mp::BasicExprFactory<std::allocator<char>_>::MakeSymbolicIf
            ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffbd0.impl_,condition_03
             ,(Expr)in_stack_fffffffffffffbe0.impl_,else_expr_03);
  return;
}

Assistant:

TEST_F(ExprTest, SymbolicIfExpr) {
  mp::SymbolicIfExpr e;
  EXPECT_TRUE(e == 0);
  (void)Expr(e);
  auto condition = factory_.MakeLogicalConstant(true);
  Expr then_expr = factory_.MakeStringLiteral("a");
  Expr else_expr = factory_.MakeVariable(0);
  e = factory_.MakeSymbolicIf(condition, then_expr, else_expr);
  EXPECT_TRUE(e != 0);
  EXPECT_EQ(expr::IFSYM, e.kind());
  EXPECT_EQ(condition, e.condition());
  EXPECT_EQ(then_expr, e.then_expr());
  EXPECT_EQ(else_expr, e.else_expr());
  EXPECT_ASSERT(factory_.MakeSymbolicIf(LogicalExpr(),
                                        then_expr, else_expr),
                "invalid argument");
  EXPECT_ASSERT(factory_.MakeSymbolicIf(condition, Expr(), else_expr),
                "invalid argument");
  factory_.MakeSymbolicIf(condition, then_expr, Expr());
}